

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O1

void __thiscall testing::InSequence::InSequence(InSequence *this)

{
  Sequence *pSVar1;
  Sequence **ppSVar2;
  Sequence *pSVar3;
  Expectation *__p;
  
  ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
  pSVar1 = *ppSVar2;
  if (pSVar1 == (Sequence *)0x0) {
    pSVar3 = (Sequence *)operator_new(0x10);
    __p = (Expectation *)operator_new(0x10);
    (__p->expectation_base_).
    super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__p->expectation_base_).
    super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pSVar3->last_expectation_).super___shared_ptr<testing::Expectation,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<testing::Expectation*>
              (&(pSVar3->last_expectation_).
                super___shared_ptr<testing::Expectation,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p
              );
    ppSVar2 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    *ppSVar2 = pSVar3;
  }
  this->sequence_created_ = pSVar1 == (Sequence *)0x0;
  return;
}

Assistant:

InSequence::InSequence() {
  if (internal::g_gmock_implicit_sequence.get() == nullptr) {
    internal::g_gmock_implicit_sequence.set(new Sequence);
    sequence_created_ = true;
  } else {
    sequence_created_ = false;
  }
}